

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O2

Name __thiscall
wasm::Outlining::addOutlinedFunction
          (Outlining *this,Module *module,RepeatedSubstring *substring,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *exprs)

{
  uint uVar1;
  Signature sig_00;
  HeapType HVar2;
  char *pcVar3;
  uint32_t exprIdx;
  ulong uVar4;
  Name NVar5;
  Name name;
  HeapType local_b0;
  string_view local_a8;
  undefined1 auStack_98 [8];
  StackSignature sig;
  undefined1 local_78 [32];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *local_58;
  HeapType local_50;
  char *local_48;
  Module *local_40;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_38;
  
  uVar1 = *(substring->StartIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58 = exprs;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_98,"outline$",(allocator<char> *)local_78);
  IString::IString((IString *)&local_a8,(string *)auStack_98);
  NVar5 = Names::getValidFunctionName(module,(Name)local_a8);
  local_50.id = NVar5.super_IString.str._M_str;
  local_48 = NVar5.super_IString.str._M_len;
  local_40 = module;
  std::__cxx11::string::~string((string *)auStack_98);
  sig.results.id._0_4_ = 0;
  auStack_98 = (undefined1  [8])0x0;
  sig.params.id = 0;
  for (uVar4 = (ulong)uVar1; uVar4 < substring->Length + uVar1; uVar4 = uVar4 + 1) {
    StackSignature::StackSignature
              ((StackSignature *)local_78,
               (local_58->
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar4]);
    StackSignature::operator+=((StackSignature *)auStack_98,(StackSignature *)local_78);
  }
  sig_00.results.id = sig.params.id;
  sig_00.params.id = (uintptr_t)auStack_98;
  HeapType::HeapType(&local_b0,sig_00);
  pcVar3 = local_48;
  HVar2.id = local_50.id;
  local_78._0_8_ = 0;
  local_78._8_8_ = 0;
  local_78._16_8_ = (pointer)0x0;
  name.super_IString.str._M_str = local_48;
  name.super_IString.str._M_len = (size_t)&local_38;
  Builder::makeFunction
            (name,local_50,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_b0.id,
             (Expression *)local_78);
  Module::addFunction(local_40,&local_38);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_38);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)local_78);
  NVar5.super_IString.str._M_str = (char *)HVar2.id;
  NVar5.super_IString.str._M_len = (size_t)pcVar3;
  return (Name)NVar5.super_IString.str;
}

Assistant:

Name addOutlinedFunction(Module* module,
                           const SuffixTree::RepeatedSubstring& substring,
                           const std::vector<Expression*>& exprs) {
    auto startIdx = substring.StartIndices[0];
    // The outlined functions can be named anything.
    Name func = Names::getValidFunctionName(*module, std::string("outline$"));
    // Calculate the function signature for the outlined sequence.
    StackSignature sig;
    for (uint32_t exprIdx = startIdx; exprIdx < startIdx + substring.Length;
         exprIdx++) {
      sig += StackSignature(exprs[exprIdx]);
    }
    module->addFunction(
      Builder::makeFunction(func, Signature(sig.params, sig.results), {}));
    return func;
  }